

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

int json_object_set_new_nocheck(json_t *json,char *key,json_t *value)

{
  int iVar1;
  size_t sVar2;
  
  if (value != (json_t *)0x0) {
    if ((((json != (json_t *)0x0 && key != (char *)0x0) && (json != value)) &&
        (json->type == JSON_OBJECT)) &&
       (iVar1 = hashtable_set((hashtable_t *)(json + 1),key,value), iVar1 == 0)) {
      return 0;
    }
    if ((value->refcount != 0xffffffffffffffff) &&
       (sVar2 = value->refcount - 1, value->refcount = sVar2, sVar2 == 0)) {
      json_delete(value);
    }
  }
  return -1;
}

Assistant:

int json_object_set_new_nocheck(json_t *json, const char *key, json_t *value)
{
	json_object_t *object;

	if (!value)
		return -1;

	if (!key || !json_is_object(json) || json == value)
	{
		json_decref(value);
		return -1;
	}
	object = json_to_object(json);

	if (hashtable_set(&object->hashtable, key, value))
	{
		json_decref(value);
		return -1;
	}

	return 0;
}